

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O3

void __thiscall
module_subset_csv_actions::from_path
          (module_subset_csv_actions *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *path)

{
  ostream *poVar1;
  pointer pbVar2;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->module_)._M_dataplus._M_p,
                      (this->module_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,s_csv_separator_abi_cxx11_._M_dataplus._M_p,
             s_csv_separator_abi_cxx11_._M_string_length);
  pbVar2 = (path->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar2 != (path->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (pbVar2 != (path->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," -> ",4);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length);
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != (path->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  return;
}

Assistant:

void from_path( std::vector<std::string> const & path )
    {
        std::cout << module_ << s_csv_separator;

        for( std::vector<std::string>::const_iterator i = path.begin(); i != path.end(); ++i )
        {
            if( i != path.begin() )
            {
                std::cout << " -> ";
            }
            std::cout << *i;
        }
        std::cout << "\n";
    }